

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::DoPreConfigureChecks(cmake *this)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  pointer pcVar4;
  cmAlphaNum local_428;
  cmAlphaNum local_3f8;
  undefined1 local_3c8 [8];
  string message;
  cmAlphaNum local_378;
  undefined1 local_348 [8];
  string currentStart;
  allocator<char> local_2f1;
  string local_2f0;
  cmValue local_2d0;
  cmAlphaNum local_2c8;
  undefined1 local_298 [8];
  string cacheStart;
  string local_270;
  cmValue local_250;
  int local_244;
  string local_240;
  undefined1 local_220 [8];
  ostringstream err;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string srcList;
  cmake *this_local;
  
  srcList.field_2._8_8_ = this;
  psVar2 = GetHomeDirectory_abi_cxx11_(this);
  cmAlphaNum::cmAlphaNum(&local_68,psVar2);
  cmAlphaNum::cmAlphaNum(&local_98,"/CMakeLists.txt");
  cmStrCat<>((string *)local_38,&local_68,&local_98);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_38);
  if (bVar1) {
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"CMAKE_HOME_DIRECTORY",
               (allocator<char> *)(cacheStart.field_2._M_local_buf + 0xf));
    local_250 = cmState::GetInitializedCacheValue(pcVar4,&local_270);
    bVar1 = cmValue::operator_cast_to_bool(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)(cacheStart.field_2._M_local_buf + 0xf));
    if (bVar1) {
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"CMAKE_HOME_DIRECTORY",&local_2f1);
      local_2d0 = cmState::GetInitializedCacheValue(pcVar4,&local_2f0);
      psVar2 = cmValue::operator*[abi_cxx11_(&local_2d0);
      cmAlphaNum::cmAlphaNum(&local_2c8,psVar2);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&currentStart.field_2 + 8),"/CMakeLists.txt");
      cmStrCat<>((string *)local_298,&local_2c8,(cmAlphaNum *)((long)&currentStart.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
      psVar2 = GetHomeDirectory_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_378,psVar2);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&message.field_2 + 8),"/CMakeLists.txt");
      cmStrCat<>((string *)local_348,&local_378,(cmAlphaNum *)((long)&message.field_2 + 8));
      bVar1 = cmsys::SystemTools::SameFile((string *)local_298,(string *)local_348);
      if (bVar1) {
        local_244 = 0;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_3f8,"The source \"");
        cmAlphaNum::cmAlphaNum(&local_428,(string *)local_348);
        cmStrCat<char[30],std::__cxx11::string,char[75]>
                  ((string *)local_3c8,&local_3f8,&local_428,
                   (char (*) [30])"\" does not match the source \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   (char (*) [75])
                   "\" used to generate cache.  Re-run cmake with a different source directory.");
        cmSystemTools::Error((string *)local_3c8);
        this_local._4_4_ = -2;
        local_244 = 1;
        std::__cxx11::string::~string((string *)local_3c8);
      }
      std::__cxx11::string::~string((string *)local_348);
      std::__cxx11::string::~string((string *)local_298);
      if (local_244 == 0) {
        this_local._4_4_ = 1;
        local_244 = 1;
      }
    }
    else {
      this_local._4_4_ = 0;
      local_244 = 1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
    psVar2 = GetHomeDirectory_abi_cxx11_(this);
    bVar1 = cmsys::SystemTools::FileIsDirectory(psVar2);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)local_220,"The source directory \"");
      psVar2 = GetHomeDirectory_abi_cxx11_(this);
      poVar3 = std::operator<<(poVar3,(string *)psVar2);
      std::operator<<(poVar3,"\" does not appear to contain CMakeLists.txt.\n");
    }
    else {
      psVar2 = GetHomeDirectory_abi_cxx11_(this);
      bVar1 = cmsys::SystemTools::FileExists(psVar2);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)local_220,"The source directory \"");
        psVar2 = GetHomeDirectory_abi_cxx11_(this);
        poVar3 = std::operator<<(poVar3,(string *)psVar2);
        std::operator<<(poVar3,"\" is a file, not a directory.\n");
      }
      else {
        poVar3 = std::operator<<((ostream *)local_220,"The source directory \"");
        psVar2 = GetHomeDirectory_abi_cxx11_(this);
        poVar3 = std::operator<<(poVar3,(string *)psVar2);
        std::operator<<(poVar3,"\" does not exist.\n");
      }
    }
    std::operator<<((ostream *)local_220,
                    "Specify --help for usage, or press the help button on the CMake GUI.");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    this_local._4_4_ = -2;
    local_244 = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  }
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmake::DoPreConfigureChecks()
{
  // Make sure the Source directory contains a CMakeLists.txt file.
  std::string srcList = cmStrCat(this->GetHomeDirectory(), "/CMakeLists.txt");
  if (!cmSystemTools::FileExists(srcList)) {
    std::ostringstream err;
    if (cmSystemTools::FileIsDirectory(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not appear to contain CMakeLists.txt.\n";
    } else if (cmSystemTools::FileExists(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" is a file, not a directory.\n";
    } else {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not exist.\n";
    }
    err << "Specify --help for usage, or press the help button on the CMake "
           "GUI.";
    cmSystemTools::Error(err.str());
    return -2;
  }

  // do a sanity check on some values
  if (this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY")) {
    std::string cacheStart =
      cmStrCat(*this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY"),
               "/CMakeLists.txt");
    std::string currentStart =
      cmStrCat(this->GetHomeDirectory(), "/CMakeLists.txt");
    if (!cmSystemTools::SameFile(cacheStart, currentStart)) {
      std::string message =
        cmStrCat("The source \"", currentStart,
                 "\" does not match the source \"", cacheStart,
                 "\" used to generate cache.  Re-run cmake with a different "
                 "source directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    return 0;
  }
  return 1;
}